

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::tiff_error_handler(char *param_1,char *fmt,__va_list_tag *ap)

{
  Exception *this;
  allocator local_849;
  string local_848 [32];
  char local_828 [8];
  char msg [2048];
  __va_list_tag *ap_local;
  char *fmt_local;
  char *param_0_local;
  
  vsprintf(local_828,fmt,ap);
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_848,local_828,&local_849);
  util::Exception::Exception(this,(string *)local_848);
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
tiff_error_handler (char const* /*module*/, char const* fmt, va_list ap)
{
    char msg[2048];
    ::vsprintf(msg, fmt, ap);
    throw util::Exception(msg);
}